

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O2

void splev_stack_push(splevstack *st,opvar *v)

{
  long lVar1;
  opvar **__src;
  opvar **__dest;
  long lVar2;
  
  if ((st != (splevstack *)0x0) && (st->stackdata != (opvar **)0x0)) {
    lVar2 = st->depth;
    lVar1 = st->depth_alloc;
    if (lVar2 < lVar1) {
      __dest = st->stackdata;
    }
    else {
      __dest = (opvar **)malloc(lVar1 * 8 + 0x400);
      __src = st->stackdata;
      memcpy(__dest,__src,lVar1 << 3);
      free(__src);
      st->stackdata = __dest;
      st->depth_alloc = st->depth_alloc + 0x80;
      lVar2 = st->depth;
    }
    __dest[lVar2] = v;
    st->depth = lVar2 + 1;
    return;
  }
  panic("splev_stack_push: no stackdata allocated?");
}

Assistant:

static void splev_stack_push(struct splevstack *st, struct opvar *v)
{
	if (!st || !st->stackdata)
	    panic("splev_stack_push: no stackdata allocated?");

	if (st->depth >= st->depth_alloc) {
	    struct opvar **tmp = malloc((st->depth_alloc + SPLEV_STACK_RESERVE) *
				        sizeof(struct opvar *));
	    memcpy(tmp, st->stackdata, st->depth_alloc * sizeof(struct opvar *));
	    Free(st->stackdata);
	    st->stackdata = tmp;
	    st->depth_alloc += SPLEV_STACK_RESERVE;
	}

	st->stackdata[st->depth] = v;
	st->depth++;
}